

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O1

btbb_piconet * get_piconet(uint32_t lap)

{
  UT_hash_bucket *pUVar1;
  UT_hash_handle *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *pUVar4;
  UT_hash_handle *pUVar5;
  UT_hash_handle *pUVar6;
  survey_hash *psVar7;
  uint uVar8;
  UT_hash_handle *pUVar9;
  long lVar10;
  btbb_piconet *pbVar11;
  survey_hash *psVar12;
  UT_hash_table *pUVar13;
  UT_hash_bucket *pUVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uchar *_hj_key;
  size_t __size;
  uint32_t lap_local;
  
  psVar7 = piconet_survey;
  if (piconet_survey == (survey_hash *)0x0) {
    lVar10 = 0;
  }
  else {
    uVar15 = lap + 0x112410d ^ 0x7f76d;
    uVar8 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
    uVar16 = uVar8 >> 0xd ^ (-0x112410d - uVar15) - uVar8;
    uVar18 = uVar16 >> 0xc ^ (uVar15 - uVar8) - uVar16;
    uVar15 = uVar18 << 0x10 ^ (uVar8 - uVar16) - uVar18;
    uVar8 = uVar15 >> 5 ^ (uVar16 - uVar18) - uVar15;
    uVar16 = uVar8 >> 3 ^ (uVar18 - uVar15) - uVar8;
    uVar15 = uVar16 << 10 ^ (uVar15 - uVar8) - uVar16;
    pUVar13 = (piconet_survey->hh).tbl;
    pUVar9 = pUVar13->buckets
             [pUVar13->num_buckets - 1 & (uVar15 >> 0xf ^ uVar8 - (uVar16 + uVar15))].hh_head;
    while( true ) {
      if (pUVar9 == (UT_hash_handle *)0x0) {
        lVar10 = 0;
      }
      else {
        lVar10 = (long)pUVar9 - pUVar13->hho;
      }
      if ((lVar10 == 0) ||
         ((*(int *)(lVar10 + 0x40) == 4 && (**(uint32_t **)(lVar10 + 0x38) == lap)))) break;
      pUVar9 = *(UT_hash_handle **)(lVar10 + 0x30);
    }
  }
  if (lVar10 == 0) {
    pbVar11 = (btbb_piconet *)calloc(1,0x1628);
    pbVar11->refcount = 1;
    pbVar11->LAP = lap;
    *(byte *)&pbVar11->flags = (byte)pbVar11->flags | 8;
    psVar12 = (survey_hash *)malloc(0x48);
    pUVar9 = &psVar12->hh;
    psVar12->key = lap;
    psVar12->pn = pbVar11;
    (psVar12->hh).next = (void *)0x0;
    (psVar12->hh).key = psVar12;
    (psVar12->hh).keylen = 4;
    if (psVar7 == (survey_hash *)0x0) {
      piconet_survey = psVar12;
      (psVar12->hh).prev = (void *)0x0;
      pUVar13 = (UT_hash_table *)malloc(0x40);
      (psVar12->hh).tbl = pUVar13;
      if (pUVar13 == (UT_hash_table *)0x0) goto LAB_00106d5d;
      *(undefined8 *)&pUVar13->num_items = 0;
      pUVar13->tail = (UT_hash_handle *)0x0;
      pUVar13->buckets = (UT_hash_bucket *)0x0;
      pUVar13->num_buckets = 0;
      pUVar13->log2_num_buckets = 0;
      pUVar13->hho = 0;
      pUVar13->ideal_chain_maxlen = 0;
      pUVar13->nonideal_items = 0;
      pUVar13->ineff_expands = 0;
      pUVar13->noexpand = 0;
      *(undefined8 *)&pUVar13->signature = 0;
      pUVar13->tail = pUVar9;
      pUVar13->num_buckets = 0x20;
      pUVar13->log2_num_buckets = 5;
      pUVar13->hho = 0x10;
      pUVar14 = (UT_hash_bucket *)malloc(0x200);
      pUVar13->buckets = pUVar14;
      if (pUVar14 == (UT_hash_bucket *)0x0) goto LAB_00106d5d;
      memset(pUVar14,0,0x200);
      pUVar13->signature = 0xa0111fe1;
    }
    else {
      pUVar13 = (psVar7->hh).tbl;
      pUVar2 = pUVar13->tail;
      pUVar2->next = psVar12;
      (psVar12->hh).prev = (void *)((long)pUVar2 - pUVar13->hho);
      pUVar13->tail = pUVar9;
    }
    psVar7 = piconet_survey;
    pUVar13 = (piconet_survey->hh).tbl;
    pUVar13->num_items = pUVar13->num_items + 1;
    (psVar12->hh).tbl = pUVar13;
    uVar15 = psVar12->key + 0x112410d ^ 0x7f76d;
    uVar8 = uVar15 << 8 ^ 0x9f49bac6 - uVar15;
    uVar16 = uVar8 >> 0xd ^ (-0x112410d - uVar15) - uVar8;
    uVar18 = uVar16 >> 0xc ^ (uVar15 - uVar8) - uVar16;
    uVar15 = uVar18 << 0x10 ^ (uVar8 - uVar16) - uVar18;
    uVar8 = uVar15 >> 5 ^ (uVar16 - uVar18) - uVar15;
    uVar16 = uVar8 >> 3 ^ (uVar18 - uVar15) - uVar8;
    uVar15 = uVar16 << 10 ^ (uVar15 - uVar8) - uVar16;
    uVar8 = uVar15 >> 0xf ^ uVar8 - (uVar16 + uVar15);
    (psVar12->hh).hashv = uVar8;
    pUVar3 = (psVar7->hh).tbl;
    uVar8 = pUVar3->num_buckets - 1 & uVar8;
    pUVar4 = pUVar3->buckets;
    pUVar14 = pUVar4 + uVar8;
    pUVar4[uVar8].count = pUVar4[uVar8].count + 1;
    pUVar2 = pUVar4[uVar8].hh_head;
    (psVar12->hh).hh_next = pUVar2;
    (psVar12->hh).hh_prev = (UT_hash_handle *)0x0;
    if (pUVar2 != (UT_hash_handle *)0x0) {
      pUVar2->hh_prev = pUVar9;
    }
    pUVar14->hh_head = pUVar9;
    if ((pUVar14->expand_mult * 10 + 10 <= pUVar14->count) && (pUVar13->noexpand != 1)) {
      __size = (ulong)(pUVar13->num_buckets * 2) << 4;
      pUVar14 = (UT_hash_bucket *)malloc(__size);
      if (pUVar14 == (UT_hash_bucket *)0x0) {
LAB_00106d5d:
        exit(-1);
      }
      memset(pUVar14,0,__size);
      uVar8 = pUVar13->num_buckets;
      uVar16 = uVar8 * 2 - 1;
      uVar15 = ((pUVar13->num_items >> ((char)pUVar13->log2_num_buckets + 1U & 0x1f)) + 1) -
               (uint)((uVar16 & pUVar13->num_items) == 0);
      pUVar13->ideal_chain_maxlen = uVar15;
      pUVar13->nonideal_items = 0;
      if ((ulong)uVar8 != 0) {
        pUVar4 = pUVar13->buckets;
        uVar19 = 0;
        do {
          pUVar2 = pUVar4[uVar19].hh_head;
          while (pUVar2 != (UT_hash_handle *)0x0) {
            pUVar5 = pUVar2->hh_next;
            uVar17 = pUVar2->hashv & uVar16;
            pUVar1 = pUVar14 + uVar17;
            uVar18 = pUVar14[uVar17].count + 1;
            pUVar14[uVar17].count = uVar18;
            if (uVar15 < uVar18) {
              pUVar13->nonideal_items = pUVar13->nonideal_items + 1;
              pUVar1->expand_mult = uVar18 / uVar15;
            }
            pUVar2->hh_prev = (UT_hash_handle *)0x0;
            pUVar6 = pUVar1->hh_head;
            pUVar2->hh_next = pUVar6;
            if (pUVar6 != (UT_hash_handle *)0x0) {
              pUVar6->hh_prev = pUVar2;
            }
            pUVar1->hh_head = pUVar2;
            pUVar2 = pUVar5;
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar8);
      }
      free(pUVar13->buckets);
      pUVar13 = pUVar9->tbl;
      pUVar13->num_buckets = pUVar13->num_buckets << 1;
      pUVar13->log2_num_buckets = pUVar13->log2_num_buckets + 1;
      pUVar13->buckets = pUVar14;
      uVar8 = 0;
      if (pUVar13->num_items >> 1 < pUVar13->nonideal_items) {
        uVar8 = pUVar13->ineff_expands + 1;
      }
      pUVar13->ineff_expands = uVar8;
      if (1 < uVar8) {
        pUVar13->noexpand = 1;
      }
    }
  }
  else {
    pbVar11 = *(btbb_piconet **)(lVar10 + 8);
  }
  return pbVar11;
}

Assistant:

btbb_piconet *get_piconet(uint32_t lap)
{
	survey_hash *s;
	btbb_piconet *pn;
	HASH_FIND(hh, piconet_survey, &lap, 4, s);

	if (s == NULL) {
		pn = btbb_piconet_new();
		btbb_init_piconet(pn, lap);

		s = malloc(sizeof(survey_hash));
		s->key = lap;
		s->pn = pn;
		HASH_ADD(hh, piconet_survey, key, 4, s);
	} else {
		pn = s->pn;
	}
	return pn;
}